

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_create(REF_SUBDIV *ref_subdiv_ptr,REF_GRID_conflict ref_grid)

{
  uint uVar1;
  REF_SUBDIV pRVar2;
  REF_INT *pRVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  
  pRVar2 = (REF_SUBDIV)malloc(0x30);
  *ref_subdiv_ptr = pRVar2;
  if (pRVar2 == (REF_SUBDIV)0x0) {
    pcVar6 = "malloc *ref_subdiv_ptr of REF_SUBDIV_STRUCT NULL";
    uVar5 = 0x86;
  }
  else {
    pRVar2->grid = ref_grid;
    uVar1 = ref_edge_create(&pRVar2->edge,ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x8e
             ,"ref_subdiv_create",(ulong)uVar1,"create edge");
      return uVar1;
    }
    uVar7 = (ulong)pRVar2->edge->n;
    if ((long)uVar7 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x91
             ,"ref_subdiv_create","malloc ref_subdiv->mark of REF_INT negative");
      return 1;
    }
    pRVar3 = (REF_INT *)malloc(uVar7 * 4);
    pRVar2->mark = pRVar3;
    if (pRVar3 == (REF_INT *)0x0) {
      pcVar6 = "malloc ref_subdiv->mark of REF_INT NULL";
      uVar5 = 0x91;
    }
    else {
      for (uVar4 = 0; uVar4 < uVar7; uVar4 = uVar4 + 1) {
        pRVar3[uVar4] = 0;
      }
      pRVar3 = (REF_INT *)malloc(uVar7 * 4);
      pRVar2->node = pRVar3;
      if (pRVar3 != (REF_INT *)0x0) {
        for (uVar4 = 0; uVar4 < uVar7; uVar4 = uVar4 + 1) {
          pRVar3[uVar4] = -1;
        }
        pRVar2->allow_geometry = 1;
        pRVar2->new_mark_allowed = 1;
        pRVar2->instrument = 0;
        pRVar2->debug = 0;
        return 0;
      }
      pcVar6 = "malloc ref_subdiv->node of REF_INT NULL";
      uVar5 = 0x93;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar5,
         "ref_subdiv_create",pcVar6);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_create(REF_SUBDIV *ref_subdiv_ptr,
                                     REF_GRID ref_grid) {
  REF_SUBDIV ref_subdiv;

  ref_malloc(*ref_subdiv_ptr, 1, REF_SUBDIV_STRUCT);

  ref_subdiv = *ref_subdiv_ptr;

  ref_subdiv_grid(ref_subdiv) = ref_grid;

  RSS(ref_edge_create(&(ref_subdiv_edge(ref_subdiv)),
                      ref_subdiv_grid(ref_subdiv)),
      "create edge");

  ref_malloc_init(ref_subdiv->mark, ref_edge_n(ref_subdiv_edge(ref_subdiv)),
                  REF_INT, 0);
  ref_malloc_init(ref_subdiv->node, ref_edge_n(ref_subdiv_edge(ref_subdiv)),
                  REF_INT, REF_EMPTY);

  ref_subdiv->allow_geometry = REF_TRUE;
  ref_subdiv->new_mark_allowed = REF_TRUE;

  ref_subdiv->instrument = REF_FALSE;
  ref_subdiv->debug = REF_FALSE;

  return REF_SUCCESS;
}